

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDisabled(bool disabled)

{
  float fVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  
  pIVar3 = GImGui;
  uVar2 = GImGui->CurrentItemFlags;
  if ((char)((uVar2 & 4) >> 2) == '\0' && disabled) {
    fVar1 = (GImGui->Style).Alpha;
    GImGui->DisabledAlphaBackup = fVar1;
    (pIVar3->Style).Alpha = fVar1 * (pIVar3->Style).DisabledAlpha;
  }
  if ((uVar2 & 4) != 0 || disabled) {
    pIVar3->CurrentItemFlags = uVar2 | 4;
  }
  ImVector<int>::push_back(&pIVar3->ItemFlagsStack,&pIVar3->CurrentItemFlags);
  pIVar3->DisabledStackSize = pIVar3->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}